

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primecandidate.c
# Opt level: O1

mp_int * pcs_generate(PrimeCandidateSource *s)

{
  uint32_t m;
  uint32_t uVar1;
  bool bVar2;
  char cVar3;
  uint32_t uVar4;
  mp_int *x;
  uint32_t uVar5;
  mp_int *unaff_R14;
  ulong uVar6;
  
  if (s->ready == false) {
    __assert_fail("s->ready",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/primecandidate.c"
                  ,0x172,"mp_int *pcs_generate(PrimeCandidateSource *)");
  }
  if (s->one_shot == true) {
    if (s->thrown_away_my_shot != false) {
      return (mp_int *)0x0;
    }
    s->thrown_away_my_shot = true;
  }
  do {
    x = mp_random_upto_fn(s->limit,random_read);
    if (s->navoids == 0) {
LAB_001164f4:
      unaff_R14 = mp_new((ulong)s->bits);
      mp_mul_into(unaff_R14,x,s->factor);
      mp_add_into(unaff_R14,unaff_R14,s->addend);
      mp_free(x);
      cVar3 = '\x01';
    }
    else {
      bVar2 = true;
      uVar4 = 0;
      uVar5 = 0;
      uVar6 = 0;
      do {
        m = s->avoids[uVar6].mod;
        uVar1 = s->avoids[uVar6].res;
        if (uVar5 != m) {
          uVar4 = mp_mod_known_integer(x,m);
          uVar5 = m;
        }
        if (uVar4 == uVar1) {
          bVar2 = false;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < s->navoids);
      if (bVar2) goto LAB_001164f4;
      mp_free(x);
      cVar3 = s->one_shot;
      if ((_Bool)cVar3 != false) {
        unaff_R14 = (mp_int *)0x0;
      }
    }
    if (cVar3 != '\0') {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

mp_int *pcs_generate(PrimeCandidateSource *s)
{
    assert(s->ready);
    if (s->one_shot) {
        if (s->thrown_away_my_shot)
            return NULL;
        s->thrown_away_my_shot = true;
    }

    while (true) {
        mp_int *x = mp_random_upto(s->limit);

        int64_t x_res = 0, last_mod = 0;
        bool ok = true;

        for (size_t i = 0; i < s->navoids; i++) {
            int64_t mod = s->avoids[i].mod, avoid_res = s->avoids[i].res;

            if (mod != last_mod) {
                last_mod = mod;
                x_res = mp_mod_known_integer(x, mod);
            }

            if (x_res == avoid_res) {
                ok = false;
                break;
            }
        }

        if (!ok) {
            mp_free(x);
            if (s->one_shot)
                return NULL;
            continue; /* try a new x */
        }

        /*
         * We've found a viable x. Make the final output value.
         */
        mp_int *toret = mp_new(s->bits);
        mp_mul_into(toret, x, s->factor);
        mp_add_into(toret, toret, s->addend);
        mp_free(x);
        return toret;
    }
}